

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_subpixel_8t_intrin_ssse3.c
# Opt level: O0

void scaledconvolve_horiz_w4
               (uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,ptrdiff_t dst_stride,
               InterpKernel *x_filters,int x0_q4,int x_step_q4,int w,int h)

{
  uint8_t *src_00;
  int16_t *in_RCX;
  uint8_t *in_RDX;
  uint8_t *in_RSI;
  long in_RDI;
  ptrdiff_t in_R8;
  uint in_R9D;
  int in_stack_00000008;
  int i;
  int16_t *x_filter;
  uint8_t *src_x;
  int x_q4;
  int z;
  int y;
  int x;
  uint8_t temp [16];
  int local_6c;
  uint local_58;
  int local_54;
  int local_50;
  int local_4c;
  uint8_t local_48 [28];
  uint local_2c;
  uint8_t *puVar1;
  
  src_00 = (uint8_t *)(in_RDI + -3);
  local_2c = in_R9D;
  for (local_50 = 0; local_50 < (int)src_x; local_50 = local_50 + 4) {
    local_58 = local_2c;
    for (local_4c = 0; local_4c < (int)x_filter; local_4c = local_4c + 4) {
      for (local_54 = 0; local_54 < 4; local_54 = local_54 + 1) {
        if ((local_58 & 0xf) == 0) {
          puVar1 = src_00;
          for (local_6c = 0; local_6c < 4; local_6c = local_6c + 1) {
            local_48[local_54 * 4 + local_6c] =
                 src_00[(long)local_6c * (long)in_RSI + (long)((int)local_58 >> 4) + 3];
          }
        }
        else {
          filter_horiz_w4_ssse3(src_00,(ptrdiff_t)in_RSI,in_RDX,in_RCX);
          puVar1 = src_00;
        }
        local_58 = in_stack_00000008 + local_58;
        src_00 = puVar1;
      }
      transpose4x4_to_dst(in_RSI,(ptrdiff_t)in_RDX,(uint8_t *)in_RCX,in_R8);
    }
    src_00 = src_00 + (long)in_RSI * 4;
    in_RDX = in_RDX + (long)in_RCX * 4;
  }
  return;
}

Assistant:

static void scaledconvolve_horiz_w4(const uint8_t *src,
                                    const ptrdiff_t src_stride, uint8_t *dst,
                                    const ptrdiff_t dst_stride,
                                    const InterpKernel *const x_filters,
                                    const int x0_q4, const int x_step_q4,
                                    const int w, const int h) {
  DECLARE_ALIGNED(16, uint8_t, temp[4 * 4]);
  int x, y, z;
  src -= SUBPEL_TAPS / 2 - 1;

  for (y = 0; y < h; y += 4) {
    int x_q4 = x0_q4;
    for (x = 0; x < w; x += 4) {
      // process 4 src_x steps
      for (z = 0; z < 4; ++z) {
        const uint8_t *const src_x = &src[x_q4 >> SUBPEL_BITS];
        const int16_t *const x_filter = x_filters[x_q4 & SUBPEL_MASK];
        if (x_q4 & SUBPEL_MASK) {
          filter_horiz_w4_ssse3(src_x, src_stride, temp + (z * 4), x_filter);
        } else {
          int i;
          for (i = 0; i < 4; ++i) {
            temp[z * 4 + i] = src_x[i * src_stride + 3];
          }
        }
        x_q4 += x_step_q4;
      }

      // transpose the 4x4 filters values back to dst
      transpose4x4_to_dst(temp, 4, dst + x, dst_stride);
    }

    src += src_stride * 4;
    dst += dst_stride * 4;
  }
}